

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<fasttext::Matrix> __thiscall fasttext::FastText::createTrainOutputMatrix(FastText *this)

{
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int *in_RSI;
  DenseMatrix *in_RDI;
  shared_ptr<fasttext::Matrix> sVar3;
  shared_ptr<fasttext::DenseMatrix> output;
  int64_t m;
  shared_ptr<fasttext::DenseMatrix> *in_stack_ffffffffffffff98;
  shared_ptr<fasttext::Matrix> *this_00;
  int local_54;
  DenseMatrix *this_01;
  long *in_stack_ffffffffffffffc8;
  shared_ptr<fasttext::Matrix> local_28;
  long local_18;
  
  this_01 = in_RDI;
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19dd1a);
  if (peVar1->model == sup) {
    peVar2 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19dd31);
    local_54 = Dictionary::nlabels(peVar2);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19dd4d);
    local_54 = Dictionary::nwords(peVar2);
  }
  local_18 = (long)local_54;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19dd6e);
  this_00 = &local_28;
  std::make_shared<fasttext::DenseMatrix,long&,int&>(in_stack_ffffffffffffffc8,in_RSI);
  std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x19dd96);
  DenseMatrix::zero(this_01);
  std::shared_ptr<fasttext::Matrix>::shared_ptr<fasttext::DenseMatrix,void>
            (this_00,in_stack_ffffffffffffff98);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x19ddb9)
  ;
  sVar3.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &in_RDI->super_Matrix;
  return (shared_ptr<fasttext::Matrix>)
         sVar3.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Matrix> FastText::createTrainOutputMatrix() const {
  int64_t m =
      (args_->model == model_name::sup) ? dict_->nlabels() : dict_->nwords();
  std::shared_ptr<DenseMatrix> output =
      std::make_shared<DenseMatrix>(m, args_->dim);
  output->zero();

  return output;
}